

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

int main(void)

{
  Logger *pLVar1;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  Logger *logger_5;
  Logger *logger_4;
  Logger *logger_3;
  Logger *logger_2;
  Logger *logger_1;
  Logger *logger;
  Logger *in_stack_fffffffffffffcb0;
  Logger *in_stack_fffffffffffffcf0;
  Logger *in_stack_fffffffffffffd10;
  Logger *in_stack_fffffffffffffd18;
  allocator *in_stack_fffffffffffffd20;
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [32];
  Logger *local_228;
  allocator local_219;
  string local_218 [39];
  allocator local_1f1;
  string local_1f0 [32];
  Logger *local_1d0;
  allocator local_1c1;
  string local_1c0 [39];
  allocator local_199;
  string local_198 [32];
  Logger *local_178;
  allocator local_169;
  string local_168 [39];
  allocator local_141;
  string local_140 [32];
  Logger *local_120;
  allocator local_111;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [32];
  Logger *local_c8;
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [32];
  Logger *local_70;
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  string local_28 [36];
  undefined4 local_4;
  
  local_4 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"./logs",&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"logger",&local_61);
  Logger::getInstance((string *)in_stack_fffffffffffffd20,(string *)in_stack_fffffffffffffd18,
                      (LogLevel)((ulong)in_stack_fffffffffffffd10 >> 0x20),
                      SUB81((ulong)in_stack_fffffffffffffd10 >> 0x18,0));
  Logger::start(in_stack_fffffffffffffcf0);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"./logs",&local_91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"default",&local_b9);
    pLVar1 = Logger::getInstance((string *)in_stack_fffffffffffffd20,
                                 (string *)in_stack_fffffffffffffd18,
                                 (LogLevel)((ulong)in_stack_fffffffffffffd10 >> 0x20),
                                 SUB81((ulong)in_stack_fffffffffffffd10 >> 0x18,0));
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    local_70 = pLVar1;
    if (pLVar1 != (Logger *)0x0) {
      my_basename(&in_stack_fffffffffffffcb0->running);
      Logger::log(pLVar1,__x);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,"./logs",&local_e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,"default",&local_111);
    pLVar1 = Logger::getInstance((string *)in_stack_fffffffffffffd20,
                                 (string *)in_stack_fffffffffffffd18,
                                 (LogLevel)((ulong)in_stack_fffffffffffffd10 >> 0x20),
                                 SUB81((ulong)in_stack_fffffffffffffd10 >> 0x18,0));
    std::__cxx11::string::~string(local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    local_c8 = pLVar1;
    if (pLVar1 != (Logger *)0x0) {
      my_basename(&in_stack_fffffffffffffcb0->running);
      Logger::log(pLVar1,__x_00);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_140,"./logs",&local_141);
    in_stack_fffffffffffffd20 = &local_169;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_168,"default",in_stack_fffffffffffffd20);
    pLVar1 = Logger::getInstance((string *)in_stack_fffffffffffffd20,
                                 (string *)in_stack_fffffffffffffd18,
                                 (LogLevel)((ulong)in_stack_fffffffffffffd10 >> 0x20),
                                 SUB81((ulong)in_stack_fffffffffffffd10 >> 0x18,0));
    std::__cxx11::string::~string(local_168);
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
    std::__cxx11::string::~string(local_140);
    std::allocator<char>::~allocator((allocator<char> *)&local_141);
    in_stack_fffffffffffffd18 = pLVar1;
    local_120 = pLVar1;
    if (pLVar1 != (Logger *)0x0) {
      my_basename(&in_stack_fffffffffffffcb0->running);
      Logger::log(pLVar1,__x_01);
      in_stack_fffffffffffffd10 = pLVar1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_198,"./logs",&local_199);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c0,"default",&local_1c1);
    pLVar1 = Logger::getInstance((string *)in_stack_fffffffffffffd20,
                                 (string *)in_stack_fffffffffffffd18,
                                 (LogLevel)((ulong)in_stack_fffffffffffffd10 >> 0x20),
                                 SUB81((ulong)in_stack_fffffffffffffd10 >> 0x18,0));
    std::__cxx11::string::~string(local_1c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
    std::__cxx11::string::~string(local_198);
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
    local_178 = pLVar1;
    if (pLVar1 != (Logger *)0x0) {
      my_basename(&in_stack_fffffffffffffcb0->running);
      Logger::log(pLVar1,__x_02);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f0,"./logs",&local_1f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_218,"default",&local_219);
    pLVar1 = Logger::getInstance((string *)in_stack_fffffffffffffd20,
                                 (string *)in_stack_fffffffffffffd18,
                                 (LogLevel)((ulong)in_stack_fffffffffffffd10 >> 0x20),
                                 SUB81((ulong)in_stack_fffffffffffffd10 >> 0x18,0));
    std::__cxx11::string::~string(local_218);
    std::allocator<char>::~allocator((allocator<char> *)&local_219);
    std::__cxx11::string::~string(local_1f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
    local_1d0 = pLVar1;
    if (pLVar1 != (Logger *)0x0) {
      my_basename(&in_stack_fffffffffffffcb0->running);
      Logger::log(pLVar1,__x_03);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_248,"./logs",&local_249);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_270,"default",&local_271);
    pLVar1 = Logger::getInstance((string *)in_stack_fffffffffffffd20,
                                 (string *)in_stack_fffffffffffffd18,
                                 (LogLevel)((ulong)in_stack_fffffffffffffd10 >> 0x20),
                                 SUB81((ulong)in_stack_fffffffffffffd10 >> 0x18,0));
    std::__cxx11::string::~string(local_270);
    std::allocator<char>::~allocator((allocator<char> *)&local_271);
    std::__cxx11::string::~string(local_248);
    std::allocator<char>::~allocator((allocator<char> *)&local_249);
    local_228 = pLVar1;
    if (pLVar1 != (Logger *)0x0) {
      my_basename(&pLVar1->running);
      Logger::log(pLVar1,__x_04);
      in_stack_fffffffffffffcb0 = pLVar1;
    }
    usleep(1000000);
  } while( true );
}

Assistant:

int main() {
    // 初始化日志模块
    Logger::getInstance("./logs", "logger", LV_TRACE, true)->start();
    while(1) {
        LOG_TRACE("This is a trace log message.");
        LOG_DEBUG("This is a debug log message.");
        LOG_INFO("This is an info log message.");
        LOG_WARN("This is a warning log message.");
        LOG_ERROR("This is an error log message.");
        LOG_FATAL("This is a fatal log message.");
        LOG_SLEEP(1000);
    }
    return 0;
}